

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O0

void __thiscall phoenix_evsa_t::_read(phoenix_evsa_t *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  kstream *pkVar4;
  evsa_body_t *this_00;
  pointer p__io;
  unique_ptr<phoenix_evsa_t::evsa_body_t,_std::default_delete<phoenix_evsa_t::evsa_body_t>_>
  local_50 [3];
  unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>> local_38 [8];
  string local_30;
  phoenix_evsa_t *local_10;
  phoenix_evsa_t *this_local;
  
  local_10 = this;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_type = uVar1;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_checksum = uVar1;
  uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_len_evsa_store_header = uVar2;
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_signature = uVar3;
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_attributes = uVar3;
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_len_evsa_store = uVar3;
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_reserved = uVar3;
  pkVar4 = (this->super_kstruct).m__io;
  uVar3 = len_evsa_store(this);
  uVar2 = len_evsa_store_header(this);
  kaitai::kstream::read_bytes_abi_cxx11_(&local_30,pkVar4,(ulong)(uVar3 - uVar2));
  std::__cxx11::string::operator=((string *)&this->m__raw_body,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  pkVar4 = (kstream *)operator_new(0x198);
  kaitai::kstream::kstream(pkVar4,&this->m__raw_body);
  std::unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>>::
  unique_ptr<std::default_delete<kaitai::kstream>,void>(local_38,pkVar4);
  std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::operator=
            (&this->m__io__raw_body,
             (unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)local_38);
  std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::~unique_ptr
            ((unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)local_38);
  this_00 = (evsa_body_t *)operator_new(0x30);
  p__io = std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::get
                    (&this->m__io__raw_body);
  evsa_body_t::evsa_body_t(this_00,p__io,this,this->m__root);
  std::unique_ptr<phoenix_evsa_t::evsa_body_t,std::default_delete<phoenix_evsa_t::evsa_body_t>>::
  unique_ptr<std::default_delete<phoenix_evsa_t::evsa_body_t>,void>
            ((unique_ptr<phoenix_evsa_t::evsa_body_t,std::default_delete<phoenix_evsa_t::evsa_body_t>>
              *)local_50,this_00);
  std::unique_ptr<phoenix_evsa_t::evsa_body_t,_std::default_delete<phoenix_evsa_t::evsa_body_t>_>::
  operator=(&this->m_body,local_50);
  std::unique_ptr<phoenix_evsa_t::evsa_body_t,_std::default_delete<phoenix_evsa_t::evsa_body_t>_>::
  ~unique_ptr(local_50);
  return;
}

Assistant:

void phoenix_evsa_t::_read() {
    m_type = m__io->read_u1();
    m_checksum = m__io->read_u1();
    m_len_evsa_store_header = m__io->read_u2le();
    m_signature = m__io->read_u4le();
    m_attributes = m__io->read_u4le();
    m_len_evsa_store = m__io->read_u4le();
    m_reserved = m__io->read_u4le();
    m__raw_body = m__io->read_bytes((len_evsa_store() - len_evsa_store_header()));
    m__io__raw_body = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_body));
    m_body = std::unique_ptr<evsa_body_t>(new evsa_body_t(m__io__raw_body.get(), this, m__root));
}